

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::variable_decl_abi_cxx11_(CompilerMSL *this,SPIRVariable *variable)

{
  long in_RDX;
  SPIRVariable *variable_local;
  CompilerMSL *this_local;
  string *expr;
  
  if (*(int *)(in_RDX + 0x10) == 4) {
    *(undefined1 *)
     ((long)&variable[0x36].dependees.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
             .ptr + 6) = 1;
  }
  CompilerGLSL::variable_decl_abi_cxx11_(&this->super_CompilerGLSL,variable);
  if (*(int *)(in_RDX + 0x10) == 4) {
    *(undefined1 *)
     ((long)&variable[0x36].dependees.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
             .ptr + 6) = 0;
  }
  return this;
}

Assistant:

std::string CompilerMSL::variable_decl(const SPIRVariable &variable)
{
	if (variable.storage == StorageClassWorkgroup)
	{
		is_using_builtin_array = true;
	}
	std::string expr = CompilerGLSL::variable_decl(variable);
	if (variable.storage == StorageClassWorkgroup)
	{
		is_using_builtin_array = false;
	}
	return expr;
}